

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_optimize.cc
# Opt level: O0

void __thiscall pass_insert_clk_en_Test::TestBody(pass_insert_clk_en_Test *this)

{
  undefined1 auVar1 [8];
  undefined8 uVar2;
  bool bVar3;
  Generator *pGVar4;
  Port *pPVar5;
  element_type *peVar6;
  element_type *peVar7;
  element_type *peVar8;
  Var *pVVar9;
  Const *right;
  char *pcVar10;
  mapped_type *pmVar11;
  long lVar12;
  Generator *top;
  char *in_R9;
  string local_b28;
  AssertHelper local_b08;
  Message local_b00;
  bool local_af1;
  undefined1 local_af0 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_ac0;
  Message local_ab8;
  bool local_aa9;
  undefined1 local_aa8 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_a78;
  Message local_a70;
  bool local_a61;
  undefined1 local_a60 [8];
  AssertionResult gtest_ar__4;
  key_type local_a48;
  string local_a28 [8];
  mapped_type child_src2;
  key_type local_a00;
  string local_9e0 [8];
  mapped_type child_src;
  key_type local_9b8;
  string local_998 [8];
  mapped_type parent_src;
  AssertHelper local_958;
  Message local_950;
  _Self local_948;
  allocator<char> local_939;
  key_type local_938;
  _Self local_918;
  bool local_909;
  undefined1 local_908 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_8d8;
  Message local_8d0;
  _Self local_8c8;
  allocator<char> local_8b9;
  key_type local_8b8;
  _Self local_898;
  bool local_889;
  undefined1 local_888 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_858;
  Message local_850;
  _Self local_848;
  allocator<char> local_839;
  key_type local_838;
  _Self local_818;
  bool local_809;
  undefined1 local_808 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_7d8;
  Message local_7d0;
  _Self local_7c8;
  allocator<char> local_7b9;
  key_type local_7b8;
  _Self local_798;
  bool local_789;
  undefined1 local_788 [8];
  AssertionResult gtest_ar_;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  src;
  string local_740;
  Port *local_720;
  Port *parent_clk_en;
  allocator<char> local_701;
  string local_700;
  enable_shared_from_this<kratos::Generator> local_6e0;
  allocator<char> local_6c9;
  string local_6c8;
  enable_shared_from_this<kratos::Generator> local_6a8;
  allocator<char> local_691;
  string local_690;
  shared_ptr<kratos::Stmt> local_670;
  allocator<char> local_659;
  string local_658;
  undefined1 local_638 [32];
  undefined1 local_618 [8];
  shared_ptr<kratos::IfStmt> if_child3;
  EventEdgeType local_5f4;
  pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_> local_5f0;
  undefined1 local_5d8 [8];
  shared_ptr<kratos::SequentialStmtBlock> child_seq3;
  string local_5c0;
  undefined1 local_5a0 [8];
  Port *clk_en_child3;
  string local_590;
  __node_base local_570;
  Port *clk_child3;
  string local_560;
  Generator *local_540;
  Generator *child3;
  allocator<char> local_521;
  string local_520;
  undefined1 local_500 [32];
  undefined1 local_4e0 [8];
  shared_ptr<kratos::IfStmt> if_child2;
  EventEdgeType local_4bc;
  pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_> local_4b8;
  undefined1 local_4a0 [8];
  shared_ptr<kratos::SequentialStmtBlock> child_seq2;
  string local_488;
  undefined1 local_468 [8];
  Port *clk_en_child2;
  string local_458;
  __node_base local_438;
  Port *clk_child2;
  string local_428;
  Generator *local_408;
  Generator *child2;
  string local_3f8;
  undefined1 local_3d8 [39];
  allocator<char> local_3b1;
  string local_3b0;
  undefined1 local_390 [32];
  enable_shared_from_this<kratos::Var> local_370;
  EventEdgeType local_35c;
  pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_> local_358;
  undefined1 local_340 [8];
  shared_ptr<kratos::SequentialStmtBlock> child_seq;
  string local_328;
  undefined1 local_308 [8];
  Port *clk_child;
  string local_2f8;
  Generator *local_2d8;
  Generator *child;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  shared_ptr<kratos::IfStmt> if_;
  EventEdgeType local_25c;
  pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_> local_258;
  enable_shared_from_this<kratos::Var> local_240;
  EventEdgeType local_22c;
  pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_> local_228;
  undefined1 local_210 [8];
  shared_ptr<kratos::SequentialStmtBlock> seq;
  string local_1f8;
  undefined1 local_1d8 [8];
  Port *a;
  string local_1c8;
  element_type *local_1a8;
  Port *rst;
  string local_198;
  __node_base local_178;
  Port *clk;
  allocator<char> local_159;
  string local_158;
  undefined8 local_138;
  Generator *parent;
  Context c;
  pass_insert_clk_en_Test *this_local;
  
  c.tracked_generators_._M_h._M_single_bucket = (__node_base_ptr)this;
  kratos::Context::Context((Context *)&parent);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"parent",&local_159);
  pGVar4 = kratos::Context::generator((Context *)&parent,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  local_138 = pGVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"clk",(allocator<char> *)((long)&rst + 7));
  pPVar5 = kratos::Generator::port(pGVar4,In,&local_198,1,Clock);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator((allocator<char> *)((long)&rst + 7));
  uVar2 = local_138;
  local_178._M_nxt = (_Hash_node_base *)pPVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,"rst",(allocator<char> *)((long)&a + 7));
  peVar6 = (element_type *)kratos::Generator::port((Generator *)uVar2,In,&local_1c8,1,AsyncReset);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&a + 7));
  uVar2 = local_138;
  local_1a8 = peVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"a",
             (allocator<char> *)
             ((long)&seq.super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  pPVar5 = kratos::Generator::port((Generator *)uVar2,Out,&local_1f8,1);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&seq.super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  local_1d8 = (undefined1  [8])pPVar5;
  kratos::Generator::sequential((Generator *)local_210);
  peVar7 = std::
           __shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_210);
  local_22c = Posedge;
  std::enable_shared_from_this<kratos::Var>::shared_from_this(&local_240);
  std::pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_>::
  pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>,_true>
            (&local_228,&local_22c,(shared_ptr<kratos::Var> *)&local_240);
  kratos::SequentialStmtBlock::add_condition(peVar7,&local_228);
  std::pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_>::~pair(&local_228);
  std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)&local_240);
  peVar7 = std::
           __shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_210);
  local_25c = Posedge;
  std::enable_shared_from_this<kratos::Var>::shared_from_this
            ((enable_shared_from_this<kratos::Var> *)
             &if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_>::
  pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>,_true>
            (&local_258,&local_25c,
             (shared_ptr<kratos::Var> *)
             &if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  kratos::SequentialStmtBlock::add_condition(peVar7,&local_258);
  std::pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_>::~pair(&local_258);
  std::shared_ptr<kratos::Var>::~shared_ptr
            ((shared_ptr<kratos::Var> *)
             &if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::make_shared<kratos::IfStmt,kratos::Port&>((Port *)local_280);
  peVar8 = std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_280);
  auVar1 = local_1d8;
  kratos::constant(1,1,false);
  kratos::Var::assign((Var *)local_2a0,(Var *)auVar1);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            ((shared_ptr<kratos::Stmt> *)(local_2a0 + 0x10),
             (shared_ptr<kratos::AssignStmt> *)local_2a0);
  kratos::IfStmt::add_then_stmt(peVar8,(shared_ptr<kratos::Stmt> *)(local_2a0 + 0x10));
  std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_2a0 + 0x10));
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_2a0);
  peVar8 = std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_280);
  auVar1 = local_1d8;
  kratos::constant(0,1,false);
  kratos::Var::assign((Var *)local_2c0,(Var *)auVar1);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            ((shared_ptr<kratos::Stmt> *)(local_2c0 + 0x10),
             (shared_ptr<kratos::AssignStmt> *)local_2c0);
  kratos::IfStmt::add_else_stmt(peVar8,(shared_ptr<kratos::Stmt> *)(local_2c0 + 0x10));
  std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_2c0 + 0x10));
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_2c0);
  peVar7 = std::
           __shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_210);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::IfStmt,void>
            ((shared_ptr<kratos::Stmt> *)&child,(shared_ptr<kratos::IfStmt> *)local_280);
  kratos::StmtBlock::add_stmt(&peVar7->super_StmtBlock,(shared_ptr<kratos::Stmt> *)&child);
  std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)&child);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f8,"child",(allocator<char> *)((long)&clk_child + 7));
  pGVar4 = kratos::Context::generator((Context *)&parent,&local_2f8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&clk_child + 7));
  local_2d8 = pGVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"clk",
             (allocator<char> *)
             ((long)&child_seq.
                     super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  pPVar5 = kratos::Generator::port(pGVar4,In,&local_328,1,Clock);
  std::__cxx11::string::~string((string *)&local_328);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&child_seq.
                     super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  local_308 = (undefined1  [8])pPVar5;
  kratos::Generator::sequential((Generator *)local_340);
  peVar7 = std::
           __shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_340);
  local_35c = Posedge;
  std::enable_shared_from_this<kratos::Var>::shared_from_this(&local_370);
  std::pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_>::
  pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>,_true>
            (&local_358,&local_35c,(shared_ptr<kratos::Var> *)&local_370);
  kratos::SequentialStmtBlock::add_condition(peVar7,&local_358);
  std::pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_>::~pair(&local_358);
  std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)&local_370);
  peVar7 = std::
           __shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_340);
  pGVar4 = local_2d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b0,"a",&local_3b1);
  pVVar9 = kratos::Generator::var(pGVar4,&local_3b0,1);
  kratos::constant(1,1,false);
  kratos::Var::assign((Var *)local_390,pVVar9);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            ((shared_ptr<kratos::Stmt> *)(local_390 + 0x10),
             (shared_ptr<kratos::AssignStmt> *)local_390);
  kratos::StmtBlock::add_stmt
            (&peVar7->super_StmtBlock,(shared_ptr<kratos::Stmt> *)(local_390 + 0x10));
  std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_390 + 0x10));
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_390);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::allocator<char>::~allocator(&local_3b1);
  peVar7 = std::
           __shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_340);
  pGVar4 = local_2d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f8,"b",(allocator<char> *)((long)&child2 + 7));
  pVVar9 = kratos::Generator::var(pGVar4,&local_3f8,1);
  kratos::constant(1,1,false);
  kratos::Var::assign((Var *)local_3d8,pVVar9);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            ((shared_ptr<kratos::Stmt> *)(local_3d8 + 0x10),
             (shared_ptr<kratos::AssignStmt> *)local_3d8);
  kratos::StmtBlock::add_stmt
            (&peVar7->super_StmtBlock,(shared_ptr<kratos::Stmt> *)(local_3d8 + 0x10));
  std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_3d8 + 0x10));
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_3d8);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&child2 + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_428,"child2",(allocator<char> *)((long)&clk_child2 + 7));
  pGVar4 = kratos::Context::generator((Context *)&parent,&local_428);
  std::__cxx11::string::~string((string *)&local_428);
  std::allocator<char>::~allocator((allocator<char> *)((long)&clk_child2 + 7));
  local_408 = pGVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_458,"clk",(allocator<char> *)((long)&clk_en_child2 + 7));
  peVar6 = (element_type *)kratos::Generator::port(pGVar4,In,&local_458,1,Clock);
  std::__cxx11::string::~string((string *)&local_458);
  std::allocator<char>::~allocator((allocator<char> *)((long)&clk_en_child2 + 7));
  pGVar4 = local_408;
  local_438._M_nxt = (_Hash_node_base *)peVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_488,"clk_en",
             (allocator<char> *)
             ((long)&child_seq2.
                     super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  pPVar5 = kratos::Generator::port(pGVar4,In,&local_488,1,ClockEnable);
  std::__cxx11::string::~string((string *)&local_488);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&child_seq2.
                     super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  pGVar4 = local_408;
  local_468 = (undefined1  [8])pPVar5;
  right = kratos::constant(1,1,false);
  kratos::Generator::wire(pGVar4,&pPVar5->super_Var,&right->super_Var);
  kratos::Generator::sequential((Generator *)local_4a0);
  peVar7 = std::
           __shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_4a0);
  local_4bc = Posedge;
  std::enable_shared_from_this<kratos::Var>::shared_from_this
            ((enable_shared_from_this<kratos::Var> *)
             &if_child2.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_>::
  pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>,_true>
            (&local_4b8,&local_4bc,
             (shared_ptr<kratos::Var> *)
             &if_child2.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  kratos::SequentialStmtBlock::add_condition(peVar7,&local_4b8);
  std::pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_>::~pair(&local_4b8);
  std::shared_ptr<kratos::Var>::~shared_ptr
            ((shared_ptr<kratos::Var> *)
             &if_child2.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::make_shared<kratos::IfStmt,kratos::Port&>((Port *)local_4e0);
  peVar8 = std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_4e0);
  pGVar4 = local_408;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_520,"a",&local_521);
  pVVar9 = kratos::Generator::var(pGVar4,&local_520,1);
  kratos::constant(1,1,false);
  kratos::Var::assign((Var *)local_500,pVVar9);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            ((shared_ptr<kratos::Stmt> *)(local_500 + 0x10),
             (shared_ptr<kratos::AssignStmt> *)local_500);
  kratos::IfStmt::add_then_stmt(peVar8,(shared_ptr<kratos::Stmt> *)(local_500 + 0x10));
  std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_500 + 0x10));
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_500);
  std::__cxx11::string::~string((string *)&local_520);
  std::allocator<char>::~allocator(&local_521);
  peVar7 = std::
           __shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_4a0);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::IfStmt,void>
            ((shared_ptr<kratos::Stmt> *)&child3,(shared_ptr<kratos::IfStmt> *)local_4e0);
  kratos::StmtBlock::add_stmt(&peVar7->super_StmtBlock,(shared_ptr<kratos::Stmt> *)&child3);
  std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)&child3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_560,"child3",(allocator<char> *)((long)&clk_child3 + 7));
  pGVar4 = kratos::Context::generator((Context *)&parent,&local_560);
  std::__cxx11::string::~string((string *)&local_560);
  std::allocator<char>::~allocator((allocator<char> *)((long)&clk_child3 + 7));
  local_540 = pGVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_590,"clk",(allocator<char> *)((long)&clk_en_child3 + 7));
  peVar6 = (element_type *)kratos::Generator::port(pGVar4,In,&local_590,1,Clock);
  std::__cxx11::string::~string((string *)&local_590);
  std::allocator<char>::~allocator((allocator<char> *)((long)&clk_en_child3 + 7));
  pGVar4 = local_540;
  local_570._M_nxt = (_Hash_node_base *)peVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5c0,"clk_en",
             (allocator<char> *)
             ((long)&child_seq3.
                     super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  pPVar5 = kratos::Generator::port(pGVar4,In,&local_5c0,1,ClockEnable);
  std::__cxx11::string::~string((string *)&local_5c0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&child_seq3.
                     super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  local_5a0 = (undefined1  [8])pPVar5;
  kratos::Generator::sequential((Generator *)local_5d8);
  peVar7 = std::
           __shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_4a0);
  local_5f4 = Posedge;
  std::enable_shared_from_this<kratos::Var>::shared_from_this
            ((enable_shared_from_this<kratos::Var> *)
             &if_child3.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_>::
  pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>,_true>
            (&local_5f0,&local_5f4,
             (shared_ptr<kratos::Var> *)
             &if_child3.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  kratos::SequentialStmtBlock::add_condition(peVar7,&local_5f0);
  std::pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_>::~pair(&local_5f0);
  std::shared_ptr<kratos::Var>::~shared_ptr
            ((shared_ptr<kratos::Var> *)
             &if_child3.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::make_shared<kratos::IfStmt,kratos::Port&>((Port *)local_618);
  peVar8 = std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_618);
  pGVar4 = local_540;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_658,"a",&local_659);
  pVVar9 = kratos::Generator::var(pGVar4,&local_658,1);
  kratos::constant(1,1,false);
  kratos::Var::assign((Var *)local_638,pVVar9);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            ((shared_ptr<kratos::Stmt> *)(local_638 + 0x10),
             (shared_ptr<kratos::AssignStmt> *)local_638);
  kratos::IfStmt::add_then_stmt(peVar8,(shared_ptr<kratos::Stmt> *)(local_638 + 0x10));
  std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_638 + 0x10));
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_638);
  std::__cxx11::string::~string((string *)&local_658);
  std::allocator<char>::~allocator(&local_659);
  peVar7 = std::
           __shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_5d8);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::IfStmt,void>
            (&local_670,(shared_ptr<kratos::IfStmt> *)local_618);
  kratos::StmtBlock::add_stmt(&peVar7->super_StmtBlock,&local_670);
  std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_670);
  uVar2 = local_138;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_690,"child",&local_691);
  std::enable_shared_from_this<kratos::Generator>::shared_from_this(&local_6a8);
  kratos::Generator::add_child_generator
            ((Generator *)uVar2,&local_690,(shared_ptr<kratos::Generator> *)&local_6a8);
  std::shared_ptr<kratos::Generator>::~shared_ptr((shared_ptr<kratos::Generator> *)&local_6a8);
  std::__cxx11::string::~string((string *)&local_690);
  std::allocator<char>::~allocator(&local_691);
  uVar2 = local_138;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6c8,"child2",&local_6c9);
  std::enable_shared_from_this<kratos::Generator>::shared_from_this(&local_6e0);
  kratos::Generator::add_child_generator
            ((Generator *)uVar2,&local_6c8,(shared_ptr<kratos::Generator> *)&local_6e0);
  std::shared_ptr<kratos::Generator>::~shared_ptr((shared_ptr<kratos::Generator> *)&local_6e0);
  std::__cxx11::string::~string((string *)&local_6c8);
  std::allocator<char>::~allocator(&local_6c9);
  uVar2 = local_138;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_700,"child3",&local_701);
  std::enable_shared_from_this<kratos::Generator>::shared_from_this
            ((enable_shared_from_this<kratos::Generator> *)&parent_clk_en);
  kratos::Generator::add_child_generator
            ((Generator *)uVar2,&local_700,(shared_ptr<kratos::Generator> *)&parent_clk_en);
  std::shared_ptr<kratos::Generator>::~shared_ptr((shared_ptr<kratos::Generator> *)&parent_clk_en);
  std::__cxx11::string::~string((string *)&local_700);
  std::allocator<char>::~allocator(&local_701);
  kratos::Generator::wire((Generator *)local_138,(Var *)local_308,(Var *)local_178._M_nxt);
  kratos::Generator::wire((Generator *)local_138,(Var *)local_438._M_nxt,(Var *)local_178._M_nxt);
  kratos::Generator::wire((Generator *)local_138,(Var *)local_570._M_nxt,(Var *)local_178._M_nxt);
  uVar2 = local_138;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_740,"clk_en",
             (allocator<char> *)((long)&src._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  pPVar5 = kratos::Generator::port((Generator *)uVar2,In,&local_740,1,ClockEnable);
  std::__cxx11::string::~string((string *)&local_740);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&src._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  local_720 = pPVar5;
  kratos::Generator::wire((Generator *)local_138,(Var *)local_5a0,&pPVar5->super_Var);
  kratos::auto_insert_clock_enable((Generator *)local_138);
  kratos::fix_assignment_type((Generator *)local_138);
  kratos::create_module_instantiation((Generator *)local_138);
  kratos::generate_verilog_abi_cxx11_
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&gtest_ar_.message_,(kratos *)local_138,top);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7b8,"parent",&local_7b9);
  local_798._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&gtest_ar_.message_,&local_7b8);
  local_7c8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&gtest_ar_.message_);
  local_789 = std::operator!=(&local_798,&local_7c8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_788,&local_789,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_7b8);
  std::allocator<char>::~allocator(&local_7b9);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_788);
  if (!bVar3) {
    testing::Message::Message(&local_7d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_788,
               (AssertionResult *)"src.find(\"parent\") != src.end()","false","true",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_7d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0xe0,pcVar10);
    testing::internal::AssertHelper::operator=(&local_7d8,&local_7d0);
    testing::internal::AssertHelper::~AssertHelper(&local_7d8);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_7d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_788);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_838,"child",&local_839);
  local_818._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&gtest_ar_.message_,&local_838);
  local_848._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&gtest_ar_.message_);
  local_809 = std::operator!=(&local_818,&local_848);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_808,&local_809,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_838);
  std::allocator<char>::~allocator(&local_839);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_808);
  if (!bVar3) {
    testing::Message::Message(&local_850);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_808,
               (AssertionResult *)"src.find(\"child\") != src.end()","false","true",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_858,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0xe1,pcVar10);
    testing::internal::AssertHelper::operator=(&local_858,&local_850);
    testing::internal::AssertHelper::~AssertHelper(&local_858);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_850);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_808);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8b8,"child2",&local_8b9);
  local_898._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&gtest_ar_.message_,&local_8b8);
  local_8c8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&gtest_ar_.message_);
  local_889 = std::operator!=(&local_898,&local_8c8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_888,&local_889,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_8b8);
  std::allocator<char>::~allocator(&local_8b9);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_888);
  if (!bVar3) {
    testing::Message::Message(&local_8d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_888,
               (AssertionResult *)"src.find(\"child2\") != src.end()","false","true",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_8d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0xe2,pcVar10);
    testing::internal::AssertHelper::operator=(&local_8d8,&local_8d0);
    testing::internal::AssertHelper::~AssertHelper(&local_8d8);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_8d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_888);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_938,"child3",&local_939);
  local_918._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&gtest_ar_.message_,&local_938);
  local_948._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&gtest_ar_.message_);
  local_909 = std::operator!=(&local_918,&local_948);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_908,&local_909,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_938);
  std::allocator<char>::~allocator(&local_939);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_908);
  if (!bVar3) {
    testing::Message::Message(&local_950);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)((long)&parent_src.field_2 + 8),(internal *)local_908,
               (AssertionResult *)"src.find(\"child3\") != src.end()","false","true",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_958,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0xe3,pcVar10);
    testing::internal::AssertHelper::operator=(&local_958,&local_950);
    testing::internal::AssertHelper::~AssertHelper(&local_958);
    std::__cxx11::string::~string((string *)(parent_src.field_2._M_local_buf + 8));
    testing::Message::~Message(&local_950);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_908);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9b8,"parent",(allocator<char> *)(child_src.field_2._M_local_buf + 0xf)
            );
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&gtest_ar_.message_,&local_9b8);
  std::__cxx11::string::string(local_998,(string *)pmVar11);
  std::__cxx11::string::~string((string *)&local_9b8);
  std::allocator<char>::~allocator((allocator<char> *)(child_src.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a00,"child",(allocator<char> *)(child_src2.field_2._M_local_buf + 0xf)
            );
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&gtest_ar_.message_,&local_a00);
  std::__cxx11::string::string(local_9e0,(string *)pmVar11);
  std::__cxx11::string::~string((string *)&local_a00);
  std::allocator<char>::~allocator((allocator<char> *)(child_src2.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a48,"child2",
             (allocator<char> *)
             ((long)&gtest_ar__4.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&gtest_ar_.message_,&local_a48);
  std::__cxx11::string::string(local_a28,(string *)pmVar11);
  std::__cxx11::string::~string((string *)&local_a48);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar__4.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  lVar12 = std::__cxx11::string::find((char *)local_998,0x4304a2);
  local_a61 = lVar12 != -1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_a60,&local_a61,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a60);
  if (!bVar3) {
    testing::Message::Message(&local_a70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_a60,
               (AssertionResult *)"parent_src.find(\"else if (clk_en)\") != std::string::npos",
               "false","true",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0xe7,pcVar10);
    testing::internal::AssertHelper::operator=(&local_a78,&local_a70);
    testing::internal::AssertHelper::~AssertHelper(&local_a78);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_a70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a60);
  lVar12 = std::__cxx11::string::find((char *)local_9e0,0x4304a7);
  local_aa9 = lVar12 != -1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_aa8,&local_aa9,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_aa8);
  if (!bVar3) {
    testing::Message::Message(&local_ab8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_aa8,
               (AssertionResult *)"child_src.find(\"if (clk_en)\") != std::string::npos","false",
               "true",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_ac0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0xe8,pcVar10);
    testing::internal::AssertHelper::operator=(&local_ac0,&local_ab8);
    testing::internal::AssertHelper::~AssertHelper(&local_ac0);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_ab8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_aa8);
  lVar12 = std::__cxx11::string::find((char *)local_a28,0x4304a7);
  local_af1 = lVar12 != -1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_af0,&local_af1,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_af0);
  if (!bVar3) {
    testing::Message::Message(&local_b00);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b28,(internal *)local_af0,
               (AssertionResult *)"child_src2.find(\"if (clk_en)\") != std::string::npos","false",
               "true",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b08,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0xe9,pcVar10);
    testing::internal::AssertHelper::operator=(&local_b08,&local_b00);
    testing::internal::AssertHelper::~AssertHelper(&local_b08);
    std::__cxx11::string::~string((string *)&local_b28);
    testing::Message::~Message(&local_b00);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_af0);
  std::__cxx11::string::~string(local_a28);
  std::__cxx11::string::~string(local_9e0);
  std::__cxx11::string::~string(local_998);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)&gtest_ar_.message_);
  std::shared_ptr<kratos::IfStmt>::~shared_ptr((shared_ptr<kratos::IfStmt> *)local_618);
  std::shared_ptr<kratos::SequentialStmtBlock>::~shared_ptr
            ((shared_ptr<kratos::SequentialStmtBlock> *)local_5d8);
  std::shared_ptr<kratos::IfStmt>::~shared_ptr((shared_ptr<kratos::IfStmt> *)local_4e0);
  std::shared_ptr<kratos::SequentialStmtBlock>::~shared_ptr
            ((shared_ptr<kratos::SequentialStmtBlock> *)local_4a0);
  std::shared_ptr<kratos::SequentialStmtBlock>::~shared_ptr
            ((shared_ptr<kratos::SequentialStmtBlock> *)local_340);
  std::shared_ptr<kratos::IfStmt>::~shared_ptr((shared_ptr<kratos::IfStmt> *)local_280);
  std::shared_ptr<kratos::SequentialStmtBlock>::~shared_ptr
            ((shared_ptr<kratos::SequentialStmtBlock> *)local_210);
  kratos::Context::~Context((Context *)&parent);
  return;
}

Assistant:

TEST(pass, insert_clk_en) {  // NOLINT
    Context c;
    auto &parent = c.generator("parent");
    auto &clk = parent.port(PortDirection::In, "clk", 1, PortType::Clock);
    auto &rst = parent.port(PortDirection::In, "rst", 1, PortType::AsyncReset);
    auto &a = parent.port(PortDirection::Out, "a", 1);

    auto seq = parent.sequential();
    seq->add_condition({EventEdgeType::Posedge, clk.shared_from_this()});
    seq->add_condition({EventEdgeType::Posedge, rst.shared_from_this()});
    auto if_ = std::make_shared<IfStmt>(rst);
    if_->add_then_stmt(a.assign(constant(1, 1)));
    if_->add_else_stmt(a.assign(constant(0, 1)));
    seq->add_stmt(if_);

    // add child generator
    auto &child = c.generator("child");
    auto &clk_child = child.port(PortDirection::In, "clk", 1, PortType::Clock);
    auto child_seq = child.sequential();
    child_seq->add_condition({EventEdgeType::Posedge, clk_child.shared_from_this()});
    child_seq->add_stmt(child.var("a", 1).assign(constant(1, 1)));
    child_seq->add_stmt(child.var("b", 1).assign(constant(1, 1)));

    // another child generator
    auto &child2 = c.generator("child2");
    auto &clk_child2 = child2.port(PortDirection::In, "clk", 1, PortType::Clock);
    auto &clk_en_child2 = child2.port(PortDirection::In, "clk_en", 1, PortType::ClockEnable);
    // always const
    child2.wire(clk_en_child2, constant(1, 1));
    auto child_seq2 = child2.sequential();
    child_seq2->add_condition({EventEdgeType::Posedge, clk_child2.shared_from_this()});
    auto if_child2 = std::make_shared<IfStmt>(clk_en_child2);
    if_child2->add_then_stmt(child2.var("a", 1).assign(constant(1, 1)));
    child_seq2->add_stmt(if_child2);

    auto &child3 = c.generator("child3");
    auto &clk_child3 = child3.port(PortDirection::In, "clk", 1, PortType::Clock);
    auto &clk_en_child3 = child3.port(PortDirection::In, "clk_en", 1, PortType::ClockEnable);
    auto child_seq3 = child3.sequential();
    child_seq2->add_condition({EventEdgeType::Posedge, clk_child3.shared_from_this()});
    auto if_child3 = std::make_shared<IfStmt>(clk_en_child3);
    if_child3->add_then_stmt(child3.var("a", 1).assign(constant(1, 1)));
    child_seq3->add_stmt(if_child3);

    parent.add_child_generator("child", child.shared_from_this());
    parent.add_child_generator("child2", child2.shared_from_this());
    parent.add_child_generator("child3", child3.shared_from_this());
    parent.wire(clk_child, clk);
    parent.wire(clk_child2, clk);
    parent.wire(clk_child3, clk);

    // add clock enable
    auto &parent_clk_en = parent.port(PortDirection::In, "clk_en", 1, PortType::ClockEnable);
    // wire it to child3
    parent.wire(clk_en_child3, parent_clk_en);
    auto_insert_clock_enable(&parent);
    fix_assignment_type(&parent);
    create_module_instantiation(&parent);
    auto src = generate_verilog(&parent);
    EXPECT_TRUE(src.find("parent") != src.end());
    EXPECT_TRUE(src.find("child") != src.end());
    EXPECT_TRUE(src.find("child2") != src.end());
    EXPECT_TRUE(src.find("child3") != src.end());
    auto parent_src = src.at("parent");
    auto child_src = src.at("child");
    auto child_src2 = src.at("child2");
    EXPECT_TRUE(parent_src.find("else if (clk_en)") != std::string::npos);
    EXPECT_TRUE(child_src.find("if (clk_en)") != std::string::npos);
    EXPECT_TRUE(child_src2.find("if (clk_en)") != std::string::npos);
}